

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::replace_trackers
          (torrent *this,
          vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          *urls)

{
  bool bVar1;
  session_settings *this_00;
  vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  *urls_local;
  torrent *this_local;
  
  tracker_list::replace(&this->m_trackers,urls);
  this_00 = settings(this);
  bVar1 = session_settings::get_bool(this_00,0x8013);
  if (bVar1) {
    tracker_list::prioritize_udp_trackers(&this->m_trackers);
  }
  if ((((byte)this->field_0x5c0 >> 6 & 1) != 0) &&
     (bVar1 = tracker_list::empty(&this->m_trackers), !bVar1)) {
    announce_with_tracker(this,none);
  }
  set_need_save_resume(this,(resume_data_flags_t)0x80);
  return;
}

Assistant:

void torrent::replace_trackers(std::vector<lt::announce_entry> const& urls)
	{
		m_trackers.replace(urls);

		if (settings().get_bool(settings_pack::prefer_udp_trackers))
			m_trackers.prioritize_udp_trackers();

		if (m_announcing && !m_trackers.empty()) announce_with_tracker();

		set_need_save_resume(torrent_handle::if_metadata_changed);
	}